

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash.c
# Opt level: O0

pchar * p_crypto_hash_get_string(PCryptoHash *hash)

{
  puchar *digest_00;
  puchar *digest;
  pchar *ret;
  PCryptoHash *hash_local;
  
  if (hash == (PCryptoHash *)0x0) {
    hash_local = (PCryptoHash *)0x0;
  }
  else {
    if (hash->closed == 0) {
      (*hash->finish)(hash->context);
      hash->closed = 1;
    }
    digest_00 = (*hash->digest)(hash->context);
    if (digest_00 == (puchar *)0x0) {
      hash_local = (PCryptoHash *)0x0;
    }
    else {
      hash_local = (PCryptoHash *)p_malloc0((ulong)(hash->hash_len * 2 + 1));
      if (hash_local == (PCryptoHash *)0x0) {
        hash_local = (PCryptoHash *)0x0;
      }
      else {
        pp_crypto_hash_digest_to_hex(digest_00,hash->hash_len,(pchar *)hash_local);
      }
    }
  }
  return (pchar *)hash_local;
}

Assistant:

P_LIB_API pchar *
p_crypto_hash_get_string (PCryptoHash *hash)
{
	pchar		*ret;
	const puchar	*digest;

	if (P_UNLIKELY (hash == NULL))
		return NULL;

	if (!hash->closed) {
		hash->finish (hash->context);
		hash->closed = TRUE;
	}

	if (P_UNLIKELY ((digest = hash->digest (hash->context)) == NULL))
		return NULL;

	if (P_UNLIKELY ((ret = p_malloc0 (hash->hash_len * 2 + 1)) == NULL))
		return NULL;

	pp_crypto_hash_digest_to_hex (digest, hash->hash_len, ret);

	return ret;
}